

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_pax.c
# Opt level: O3

void compare_acls(archive_entry *ae,acl_t *acls,int n,int mode)

{
  char cVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  mode_t mVar7;
  ulong uVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  wchar_t wVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int permset;
  int qual;
  int type;
  int tag;
  char *name;
  wchar_t local_88;
  wchar_t local_84;
  wchar_t local_80;
  uint local_7c;
  uint local_78;
  wchar_t local_74;
  char *local_70;
  int *local_68;
  archive_entry *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  wchar_t local_44;
  uint local_40;
  wchar_t local_3c;
  char *local_38;
  
  local_7c = mode;
  local_60 = ae;
  local_68 = (int *)malloc((ulong)(uint)n * 4);
  auVar3 = _DAT_0023b030;
  if (0 < n) {
    lVar11 = (ulong)(uint)n - 1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar8 = 0;
    auVar14 = auVar14 ^ _DAT_0023b030;
    auVar15 = _DAT_0023b020;
    do {
      auVar16 = auVar15 ^ auVar3;
      if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                  auVar14._4_4_ < auVar16._4_4_) & 1)) {
        local_68[uVar8] = (int)uVar8;
      }
      if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
          auVar16._12_4_ <= auVar14._12_4_) {
        local_68[uVar8 + 1] = (int)uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar11 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar11 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar8);
  }
  wVar5 = archive_entry_acl_next(local_60,L'Ā',&local_80,&local_88,&local_74,&local_84,&local_70);
  if (wVar5 == L'\0') {
    local_44 = local_7c & 7;
    local_48 = local_7c >> 3 & 7;
    local_4c = local_7c & 0x38;
    local_50 = local_7c >> 6 & 7;
    local_54 = local_7c & 0x1c0;
    do {
      wVar4 = local_74;
      wVar12 = local_80;
      wVar5 = local_88;
      bVar2 = true;
      if (n < 1) {
        wVar5 = L'\0';
      }
      else {
        uVar13 = local_74 + L'\xffffd8ee';
        uVar8 = 0;
        piVar9 = local_68;
        local_38 = local_70;
        local_3c = local_84;
        local_78 = n;
        do {
          iVar6 = piVar9[uVar8];
          if (((acls[iVar6].type == wVar12) && (acls[iVar6].permset == wVar5)) &&
             (acls[iVar6].tag == wVar4)) {
            if ((uVar13 < 5) && ((0x15U >> (uVar13 & 0x1f) & 1) != 0)) {
LAB_0012070b:
              piVar9[uVar8] = piVar9[(ulong)(uint)n - 1];
              n = local_78 - 1;
              wVar5 = L'\x01';
              bVar2 = false;
              goto LAB_00120727;
            }
            if (acls[iVar6].qual == local_3c) {
              pcVar10 = acls[iVar6].name;
              if (local_38 == (char *)0x0) {
                if (pcVar10 == (char *)0x0) goto LAB_0012070b;
                cVar1 = *pcVar10;
              }
              else {
                if (pcVar10 != (char *)0x0) {
                  local_40 = uVar13;
                  iVar6 = strcmp(local_38,pcVar10);
                  piVar9 = local_68;
                  uVar13 = local_40;
                  if (iVar6 == 0) goto LAB_0012070b;
                  goto LAB_001206f1;
                }
                cVar1 = *local_38;
              }
              if (cVar1 == '\0') goto LAB_0012070b;
            }
          }
LAB_001206f1:
          bVar2 = true;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (uint)n);
        wVar5 = L'\0';
        n = local_78;
      }
LAB_00120727:
      if (wVar4 == L'✖') {
        if (bVar2) {
          puts("No match for other perm");
        }
        wVar5 = local_44;
        failure("OTHER permset (%02o) != other mode (%02o)",(ulong)(uint)local_88,
                (ulong)(uint)local_44);
        wVar5 = (wchar_t)(local_88 == wVar5);
        wVar12 = L'½';
        pcVar10 = "(permset << 0) == (mode & 0007)";
      }
      else if (wVar4 == L'✔') {
        if (bVar2) {
          puts("No match for group_obj perm");
        }
        failure("GROUP_OBJ permset %02o != group mode %02o",(ulong)(uint)local_88,(ulong)local_48);
        wVar5 = (wchar_t)(local_88 << 3 == local_4c);
        wVar12 = L'¸';
        pcVar10 = "(permset << 3) == (mode & 0070)";
      }
      else if (wVar4 == L'✒') {
        if (bVar2) {
          puts("No match for user_obj perm");
        }
        failure("USER_OBJ permset (%02o) != user mode (%02o)",(ulong)(uint)local_88,(ulong)local_50)
        ;
        wVar5 = (wchar_t)(local_88 << 6 == local_54);
        wVar12 = L'³';
        pcVar10 = "(permset << 6) == (mode & 0700)";
      }
      else {
        failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
                (ulong)(uint)local_80,(ulong)(uint)local_88,(ulong)(uint)wVar4,(ulong)(uint)local_84
                ,local_70);
        wVar12 = L'Â';
        pcVar10 = "matched == 1";
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                       ,wVar12,wVar5,pcVar10,(void *)0x0);
      wVar5 = archive_entry_acl_next
                        (local_60,L'Ā',&local_80,&local_88,&local_74,&local_84,&local_70);
    } while (wVar5 == L'\0');
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                      ,L'Å',1,"ARCHIVE_EOF",(long)wVar5,"r",(void *)0x0);
  mVar7 = archive_entry_mode(local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'Æ',(uint)(((mVar7 ^ local_7c) & 0x1ff) == 0),
                   "(mode_t)(mode & 0777) == (archive_entry_mode(ae) & 0777)",(void *)0x0);
  piVar9 = local_68;
  iVar6 = *local_68;
  failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
          (ulong)(uint)acls[iVar6].type,(ulong)(uint)acls[iVar6].permset,
          (ulong)(uint)acls[iVar6].tag,(ulong)(uint)acls[iVar6].qual,acls[iVar6].name);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                   ,L'Ë',(uint)(n == 0),"n == 0",(void *)0x0);
  free(piVar9);
  return;
}

Assistant:

static void
compare_acls(struct archive_entry *ae, struct acl_t *acls, int n, int mode)
{
	int *marker = malloc(sizeof(marker[0]) * n);
	int i;
	int r;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	for (i = 0; i < n; i++)
		marker[i] = i;

	while (0 == (r = archive_entry_acl_next(ae,
			 ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (acl_match(&acls[marker[i]], type, permset,
				tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ) {
			if (!matched) printf("No match for user_obj perm\n");
			failure("USER_OBJ permset (%02o) != user mode (%02o)",
			    permset, 07 & (mode >> 6));
			assert((permset << 6) == (mode & 0700));
		} else if (tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ) {
			if (!matched) printf("No match for group_obj perm\n");
			failure("GROUP_OBJ permset %02o != group mode %02o",
			    permset, 07 & (mode >> 3));
			assert((permset << 3) == (mode & 0070));
		} else if (tag == ARCHIVE_ENTRY_ACL_OTHER) {
			if (!matched) printf("No match for other perm\n");
			failure("OTHER permset (%02o) != other mode (%02o)",
			    permset, mode & 07);
			assert((permset << 0) == (mode & 0007));
		} else {
			failure("Could not find match for ACL "
			    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
			    type, permset, tag, qual, name);
			assert(matched == 1);
		}
	}
	assertEqualInt(ARCHIVE_EOF, r);
	assert((mode_t)(mode & 0777) == (archive_entry_mode(ae) & 0777));
	failure("Could not find match for ACL "
	    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
	    acls[marker[0]].type, acls[marker[0]].permset,
	    acls[marker[0]].tag, acls[marker[0]].qual, acls[marker[0]].name);
	assert(n == 0); /* Number of ACLs not matched should == 0 */
	free(marker);
}